

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O1

void __thiscall
llbuild::core::BuildEngine::BuildEngine(BuildEngine *this,BuildEngineDelegate *delegate)

{
  long lVar1;
  undefined8 *puVar2;
  void *pvVar3;
  void *pvVar4;
  ulong uVar5;
  
  puVar2 = (undefined8 *)operator_new(0x368);
  *puVar2 = &PTR__BuildEngineImpl_001e7410;
  puVar2[1] = this;
  puVar2[2] = delegate;
  puVar2[3] = 0;
  puVar2[4] = 0;
  puVar2[5] = 0x1000000000;
  puVar2[7] = 0;
  puVar2[8] = 0;
  puVar2[9] = 0;
  puVar2[10] = 0;
  puVar2[0xb] = 0;
  puVar2[0xc] = 0;
  puVar2[0xd] = 0;
  puVar2[0xe] = puVar2 + 0x10;
  puVar2[0xf] = 0;
  *(undefined1 *)(puVar2 + 0x10) = 0;
  puVar2[0x22] = 0;
  puVar2[0x23] = 0;
  puVar2[0x24] = 0;
  puVar2[0x25] = 0;
  puVar2[0x26] = 0;
  puVar2[0x27] = 0;
  puVar2[0x28] = 0;
  puVar2[0x29] = 0;
  puVar2[0x2a] = 0;
  puVar2[0x2b] = 0;
  *(undefined8 *)((long)puVar2 + 0xba) = 0;
  *(undefined8 *)((long)puVar2 + 0xc2) = 0;
  puVar2[0x16] = 0;
  puVar2[0x17] = 0;
  puVar2[0x14] = 0;
  puVar2[0x15] = 0;
  puVar2[0x12] = 0;
  puVar2[0x13] = 0;
  *(undefined8 *)((long)puVar2 + 0xfc) = 0;
  *(undefined8 *)((long)puVar2 + 0x104) = 0;
  puVar2[0x1e] = 0;
  puVar2[0x1f] = 0;
  puVar2[0x1c] = 0;
  puVar2[0x1d] = 0;
  puVar2[0x1a] = 0;
  puVar2[0x1b] = 0;
  puVar2[0x23] = 8;
  pvVar3 = operator_new(0x40);
  puVar2[0x22] = pvVar3;
  uVar5 = puVar2[0x23] * 4 - 4U & 0xfffffffffffffff8;
  lVar1 = (long)pvVar3 + uVar5;
  pvVar4 = operator_new(0x200);
  *(void **)((long)pvVar3 + uVar5) = pvVar4;
  puVar2[0x27] = lVar1;
  puVar2[0x25] = pvVar4;
  puVar2[0x26] = (long)pvVar4 + 0x200;
  puVar2[0x2b] = lVar1;
  puVar2[0x29] = pvVar4;
  puVar2[0x2a] = (long)pvVar4 + 0x200;
  puVar2[0x24] = pvVar4;
  puVar2[0x28] = pvVar4;
  puVar2[0x2c] = 0;
  puVar2[0x2d] = 0;
  puVar2[0x2e] = 0;
  puVar2[0x2f] = 0;
  puVar2[0x30] = 0;
  puVar2[0x31] = 0;
  puVar2[0x32] = 0;
  puVar2[0x33] = 0;
  puVar2[0x34] = 0;
  puVar2[0x35] = 0;
  puVar2[0x36] = 0;
  puVar2[0x37] = puVar2 + 0x3d;
  puVar2[0x38] = 1;
  puVar2[0x39] = 0;
  puVar2[0x3a] = 0;
  *(undefined4 *)(puVar2 + 0x3b) = 0x3f800000;
  puVar2[0x3c] = 0;
  puVar2[0x3d] = 0;
  puVar2[0x3e] = puVar2 + 0x44;
  puVar2[0x3f] = 1;
  puVar2[0x40] = 0;
  puVar2[0x41] = 0;
  *(undefined4 *)(puVar2 + 0x42) = 0x3f800000;
  memset(puVar2 + 0x43,0,0x88);
  puVar2[0x4b] = 8;
  pvVar3 = operator_new(0x40);
  puVar2[0x4a] = pvVar3;
  uVar5 = puVar2[0x4b] * 4 - 4U & 0xfffffffffffffff8;
  lVar1 = (long)pvVar3 + uVar5;
  pvVar4 = operator_new(0x200);
  *(void **)((long)pvVar3 + uVar5) = pvVar4;
  puVar2[0x4f] = lVar1;
  puVar2[0x4d] = pvVar4;
  puVar2[0x4e] = (long)pvVar4 + 0x200;
  puVar2[0x53] = lVar1;
  puVar2[0x51] = pvVar4;
  puVar2[0x52] = (long)pvVar4 + 0x200;
  puVar2[0x4c] = pvVar4;
  puVar2[0x50] = pvVar4;
  *(undefined4 *)(puVar2 + 0x54) = 0;
  puVar2[0x5b] = 0;
  puVar2[0x5c] = 0;
  puVar2[0x59] = 0;
  puVar2[0x5a] = 0;
  puVar2[0x57] = 0;
  puVar2[0x58] = 0;
  puVar2[0x55] = 0;
  puVar2[0x56] = 0;
  std::condition_variable::condition_variable((condition_variable *)(puVar2 + 0x5d));
  puVar2[0x65] = 0;
  puVar2[99] = 0;
  puVar2[100] = 0;
  puVar2[0x66] = 0x1fa0;
  puVar2[0x67] = 0;
  puVar2[0x68] = 0;
  puVar2[0x69] = 0;
  puVar2[0x6a] = 0x1000;
  puVar2[0x6b] = 0;
  puVar2[0x6c] = 0;
  this->impl = puVar2;
  return;
}

Assistant:

BuildEngine::BuildEngine(BuildEngineDelegate& delegate)
  : impl(new BuildEngineImpl(*this, delegate))
{
}